

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QList<QString> *
(anonymous_namespace)::splitString<QList<QString>,QString>
          (QString *source,QStringView sep,SplitBehavior behavior,CaseSensitivity cs)

{
  bool bVar1;
  QChar *pos;
  QStringView *pQVar2;
  qsizetype qVar3;
  QString *in_RSI;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  qsizetype unaff_retaddr;
  size_type extra;
  size_type end;
  size_type start;
  QList<QString> *list;
  QStringView in_stack_00000080;
  rvalue_ref in_stack_ffffffffffffff08;
  SplitBehaviorFlags in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  QChar *in_stack_ffffffffffffff18;
  QStringView *in_stack_ffffffffffffff20;
  QList<QString> *this;
  QStringView *local_a0;
  QStringView local_18;
  long lVar4;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QList<QString>::QList((QList<QString> *)0x518776);
  local_a0 = (QStringView *)0x0;
  while( true ) {
    pos = QString::constData((QString *)0x5187a1);
    QString::size(in_RSI);
    QStringView::QStringView<QChar,_true>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    pQVar2 = (QStringView *)
             QtPrivate::findString
                       (in_stack_00000080,unaff_retaddr,(QStringView)_list,
                        (CaseSensitivity)((ulong)lVar4 >> 0x20));
    if (pQVar2 == (QStringView *)0xffffffffffffffff) break;
    if ((local_a0 != pQVar2) ||
       (bVar1 = ::operator==((QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)
                             SUB84((ulong)in_stack_ffffffffffffff18 >> 0x20,0),
                             in_stack_ffffffffffffff10), bVar1)) {
      QString::sliced((QString *)in_stack_ffffffffffffff20,(qsizetype)in_stack_ffffffffffffff18,
                      CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      QList<QString>::append
                ((QList<QString> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08);
      QString::~QString((QString *)0x51889a);
    }
    qVar3 = QStringView::size(&local_18);
    local_a0 = (QStringView *)((long)&pQVar2->m_size + qVar3);
    QStringView::size(&local_18);
    in_stack_ffffffffffffff20 = pQVar2;
  }
  pQVar2 = (QStringView *)QString::size(in_RSI);
  if ((local_a0 != pQVar2) ||
     (bVar1 = ::operator==((QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)
                           SUB84((ulong)local_a0 >> 0x20,0),in_stack_ffffffffffffff10), bVar1)) {
    QString::sliced((QString *)this,(qsizetype)pos);
    QList<QString>::append
              ((QList<QString> *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    QString::~QString((QString *)0x51899c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static ResultList splitString(const StringSource &source, QStringView sep,
                              Qt::SplitBehavior behavior, Qt::CaseSensitivity cs)
{
    ResultList list;
    typename StringSource::size_type start = 0;
    typename StringSource::size_type end;
    typename StringSource::size_type extra = 0;
    while ((end = QtPrivate::findString(QStringView(source.constData(), source.size()), start + extra, sep, cs)) != -1) {
        if (start != end || behavior == Qt::KeepEmptyParts)
            list.append(source.sliced(start, end - start));
        start = end + sep.size();
        extra = (sep.size() == 0 ? 1 : 0);
    }
    if (start != source.size() || behavior == Qt::KeepEmptyParts)
        list.append(source.sliced(start));
    return list;
}